

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::EigenSystem
          (TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  TFad<6,_double> *pTVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long local_2a8;
  TPZStack<int,_3> indices_to_add;
  undefined **local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  TPZTensor<TFad<6,_double>_> sum;
  TFad<6,double> local_70 [64];
  
  local_258 = &PTR__TFad_0166af08;
  local_248 = 0;
  uStack_240 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_250 = 0x3d719799812dea11;
  Norm((TFad<6,_double> *)&sum,this);
  indices_to_add.super_TPZManVector<int,_3>.super_TPZVec<int>.fStore = (int *)&local_258;
  indices_to_add.super_TPZManVector<int,_3>.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&sum;
  TFad<6,double>::TFad<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>
            (local_70,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&indices_to_add
            );
  ComputeEigenvectors(this,eigensystem);
  TPZStack<int,_3>::TPZStack(&indices_to_add);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    if ((eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[lVar7] != 1) {
      TPZStack<int,_3>::Push(&indices_to_add,(int)lVar7);
    }
    lVar9 = 0;
    lVar5 = 0;
    local_2a8 = 4;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      for (lVar8 = lVar9; lVar8 != 0xc0; lVar8 = lVar8 + 0x40) {
        pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore
                 [lVar7].super_TPZVec<TFad<6,_double>_>.fStore;
        sum.super_TPZSavable._vptr_TPZSavable = (_func_int **)(pTVar1 + lVar6);
        sum.fData.super_TPZVec<TFad<6,_double>_>._vptr_TPZVec =
             (_func_int **)((long)pTVar1->dx_ + lVar8 + -0x10);
        TFad<6,double>::operator=
                  ((TFad<6,double> *)
                   ((long)((eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.
                           fStore[lVar7].fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_ +
                   lVar8 + lVar5 * 0x20 + -0x10),
                   (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&sum);
      }
      lVar5 = lVar5 + local_2a8;
      local_2a8 = local_2a8 + -2;
      lVar9 = lVar9 + 0x40;
    }
  }
  if (0 < indices_to_add.super_TPZManVector<int,_3>.super_TPZVec<int>.fNElements) {
    TPZTensor(&sum);
    ppiVar2 = TPZVec<int>::begin((TPZVec<int> *)&indices_to_add);
    piVar4 = *ppiVar2;
    piVar3 = TPZVec<int>::end((TPZVec<int> *)&indices_to_add);
    for (; piVar4 != piVar3; piVar4 = piVar4 + 1) {
      operator+=(&sum,(eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore
                      + *piVar4);
    }
    ppiVar2 = TPZVec<int>::begin((TPZVec<int> *)&indices_to_add);
    piVar4 = *ppiVar2;
    piVar3 = TPZVec<int>::end((TPZVec<int> *)&indices_to_add);
    for (; piVar4 != piVar3; piVar4 = piVar4 + 1) {
      TPZManVector<TFad<6,_double>,_6>::operator=
                (&(eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore
                  [*piVar4].fData,&sum.fData);
    }
    ~TPZTensor(&sum);
  }
  TPZManVector<int,_3>::~TPZManVector(&indices_to_add.super_TPZManVector<int,_3>);
  return;
}

Assistant:

void TPZTensor<T>::EigenSystem(TPZDecomposed &eigensystem)const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZTensor<T>, 3> &eigentensors = eigensystem.fEigentensors;

    T precision;
    ZeroTolerance(precision);
    T tol = Norm()*precision;
    ComputeEigenvectors(eigensystem);

    TPZStack<int, 3> indices_to_add;
    for (unsigned int i = 0; i < 3; ++i) {
        if (eigensystem.fGeometricMultiplicity[i] != 1) {
            indices_to_add.push_back(i);
        }
        for (unsigned int j = 0; j < 3; ++j) {
            for (unsigned int k = j; k < 3; ++k) {
                eigentensors[i](j, k) = eigensystem.fEigenvectors[i][j] * eigensystem.fEigenvectors[i][k];
            }
        }
    }
    if (indices_to_add.size() > 0) {
        TPZTensor<T> sum;
        for (auto i : indices_to_add) {
            sum += eigentensors[i];
        }
        for (auto i : indices_to_add) {
            eigentensors[i] = sum;
        }
    }
#ifdef PZDEBUG
    TPZTensor<T> total;
    unsigned int i;
    for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
        total.Add(eigentensors[i], eigenvalues[i]);
    }
    if (i != 3) {
        std::cout << "Tensor decomposition error: " << std::endl;
        std::cout << "Incorrect total geometric multiplicity: " << i << std::endl;
        DebugStop();
    }
    for (unsigned int i = 0; i < 6; ++i) {
        if (!AreEqual(total[i], this->operator[](i), tol)) {
            std::cout << std::setprecision(15);
            std::cout << "Tensor decomposition error: " << std::endl;
            std::cout << "Original Tensor: ";
            this->Print(std::cout);
            std::cout << "Reconstruction from decomposition: ";
            total.Print(std::cout);
            std::cout << "Decomposition: " << std::endl;
            eigensystem.Print(std::cout);
            DebugStop();
        }
    }
#endif
}